

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void geopolyOverlapFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVal;
  GeoPoly *p1;
  GeoPoly *p2;
  
  p1 = geopolyFuncParam(context,*argv,(int *)0x0);
  p2 = geopolyFuncParam(context,argv[1],(int *)0x0);
  if (p2 != (GeoPoly *)0x0 && p1 != (GeoPoly *)0x0) {
    iVal = geopolyOverlap(p1,p2);
    if (iVal < 0) {
      sqlite3_result_error_nomem(context);
    }
    else {
      sqlite3_result_int(context,iVal);
    }
  }
  sqlite3_free(p1);
  sqlite3_free(p2);
  return;
}

Assistant:

static void geopolyOverlapFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p1 = geopolyFuncParam(context, argv[0], 0);
  GeoPoly *p2 = geopolyFuncParam(context, argv[1], 0);
  (void)argc;
  if( p1 && p2 ){
    int x = geopolyOverlap(p1, p2);
    if( x<0 ){
      sqlite3_result_error_nomem(context);
    }else{
      sqlite3_result_int(context, x);
    }
  }
  sqlite3_free(p1);
  sqlite3_free(p2);
}